

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm.cpp
# Opt level: O3

int __thiscall
ncnn::LSTM::forward(LSTM *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
                   vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  uint _h;
  int iVar1;
  Mat *bottom_blob;
  Allocator *_allocator;
  Mat *this_00;
  int *piVar2;
  bool bVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  uint uVar6;
  int iVar7;
  size_t sVar8;
  pointer pMVar9;
  ulong uVar10;
  void *in_R8;
  int _h_00;
  void *__src;
  void *__dest;
  Mat m;
  Mat m_11;
  Mat m_3;
  Mat m_10;
  Mat local_288;
  Mat local_238;
  Mat m_8;
  Mat m_2;
  Mat m_1;
  Mat m_9;
  Mat m_19;
  Mat m_18;
  
  bottom_blob = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
  _h = bottom_blob->h;
  iVar1 = this->direction;
  local_238.cstep = 0;
  local_238.data = (void *)0x0;
  local_238.refcount._0_4_ = 0;
  local_238.refcount._4_4_ = 0;
  local_238.elemsize._0_4_ = 0;
  local_238.elemsize._4_4_ = 0;
  local_238.elempack = 0;
  local_238.allocator = (Allocator *)0x0;
  local_238.dims = 0;
  local_238.w = 0;
  local_238.h = 0;
  local_238.d = 0;
  local_238.c = 0;
  local_288.cstep = 0;
  local_288.data = (void *)0x0;
  local_288.refcount._0_4_ = 0;
  local_288.refcount._4_4_ = 0;
  local_288.elemsize._0_4_ = 0;
  local_288.elemsize._4_4_ = 0;
  local_288.elempack = 0;
  local_288.allocator = (Allocator *)0x0;
  local_288.dims = 0;
  local_288.w = 0;
  local_288.h = 0;
  local_288.d = 0;
  local_288.c = 0;
  _allocator = (&opt->blob_allocator)
               [(long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_finish -
                (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_start != 0xd8];
  if ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)bottom_blob == 0xd8) {
    Mat::clone(&m,(__fn *)(bottom_blob + 1),_allocator,0xd8,in_R8);
    piVar2 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    piVar2 = (int *)CONCAT44(local_238.refcount._4_4_,local_238.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_238.allocator == (Allocator *)0x0) {
          if (local_238.data != (void *)0x0) {
            free(local_238.data);
          }
        }
        else {
          (*(local_238.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar2 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    local_238.data = m.data;
    local_238.refcount._0_4_ = m.refcount._0_4_;
    local_238.refcount._4_4_ = m.refcount._4_4_;
    local_238.elemsize._0_4_ = (undefined4)m.elemsize;
    local_238.elemsize._4_4_ = m.elemsize._4_4_;
    local_238.elempack = m.elempack;
    local_238.allocator = m.allocator;
    local_238.dims = m.dims;
    local_238.w = m.w;
    local_238.h = m.h;
    uVar4._0_4_ = m.d;
    uVar4._4_4_ = m.c;
    local_238.d = m.d;
    local_238.c = m.c;
    local_238.cstep = m.cstep;
    sVar8 = m.cstep;
    uVar5 = uVar4;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      uVar5 = local_238._52_8_;
      if (*piVar2 == 0) {
        if (m.allocator == (Allocator *)0x0) {
          if (m.data != (void *)0x0) {
            local_238._52_8_ = uVar4;
            free(m.data);
            uVar5 = local_238._52_8_;
          }
        }
        else {
          local_238._52_8_ = uVar4;
          (*(m.allocator)->_vptr_Allocator[3])();
          uVar5 = local_238._52_8_;
        }
      }
    }
    local_238._52_8_ = uVar5;
    Mat::clone(&m,(__fn *)((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)
                           ._M_impl.super__Vector_impl_data._M_start + 2),_allocator,(int)sVar8,
               in_R8);
    piVar2 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    piVar2 = (int *)CONCAT44(local_288.refcount._4_4_,local_288.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_288.allocator == (Allocator *)0x0) {
          if (local_288.data != (void *)0x0) {
            free(local_288.data);
          }
        }
        else {
          (*(local_288.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar2 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    local_288.data = m.data;
    local_288.refcount._0_4_ = m.refcount._0_4_;
    local_288.refcount._4_4_ = m.refcount._4_4_;
    local_288.elemsize._0_4_ = (undefined4)m.elemsize;
    local_288.elemsize._4_4_ = m.elemsize._4_4_;
    local_288.elempack = m.elempack;
    local_288.allocator = m.allocator;
    local_288.dims = m.dims;
    local_288.w = m.w;
    local_288.h = m.h;
    local_288.d = m.d;
    local_288.c = m.c;
    local_288.cstep = m.cstep;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (m.allocator == (Allocator *)0x0) {
          if (m.data != (void *)0x0) {
            free(m.data);
          }
        }
        else {
          (*(m.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  else {
    _h_00 = (iVar1 == 2) + 1;
    Mat::create(&local_238,this->num_output,_h_00,4,_allocator);
    iVar7 = -100;
    if (local_238.data == (void *)0x0) goto LAB_00354932;
    if (local_238.cstep * (long)local_238.c == 0) goto LAB_00354932;
    uVar6 = (int)local_238.cstep * local_238.c;
    if (0 < (int)uVar6) {
      memset(local_238.data,0,(ulong)uVar6 << 2);
    }
    Mat::create(&local_288,this->hidden_size,_h_00,4,_allocator);
    if (local_288.data == (void *)0x0) goto LAB_00354932;
    if (local_288.cstep * (long)local_288.c == 0) goto LAB_00354932;
    uVar6 = (int)local_288.cstep * local_288.c;
    if (0 < (int)uVar6) {
      memset(local_288.data,0,(ulong)uVar6 << 2);
    }
  }
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  Mat::create(this_00,this->num_output << (iVar1 == 2),_h,4,opt->blob_allocator);
  iVar7 = -100;
  if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
    uVar6 = this->direction;
    if (uVar6 < 2) {
      if (this->int8_scale_term == 0) {
        m.w = (this->weight_xc_data).w;
        m.h = (this->weight_xc_data).h;
        m.data = (this->weight_xc_data).data;
        uVar10 = (this->weight_xc_data).elemsize;
        m.elempack = (this->weight_xc_data).elempack;
        m.allocator = (this->weight_xc_data).allocator;
        m.refcount._0_4_ = 0;
        m.refcount._4_4_ = 0;
        m.elemsize._0_4_ = (undefined4)uVar10;
        m.elemsize._4_4_ = (undefined4)(uVar10 >> 0x20);
        m.c = (this->weight_xc_data).d;
        m.d = 1;
        iVar1 = (this->weight_xc_data).dims;
        m.dims = iVar1 + -1;
        m.cstep = (uVar10 * (long)m.h * (long)m.w + 0xf & 0xfffffffffffffff0) / uVar10;
        if (iVar1 == 4) {
          m.cstep = (long)m.h * (long)m.w;
        }
        m_1.w = (this->bias_c_data).w;
        m_1.h = (this->bias_c_data).h;
        m_1.data = (this->bias_c_data).data;
        uVar10 = (this->bias_c_data).elemsize;
        m_1.elempack = (this->bias_c_data).elempack;
        m_1.allocator = (this->bias_c_data).allocator;
        m_1.refcount._0_4_ = 0;
        m_1.refcount._4_4_ = 0;
        m_1.elemsize._0_4_ = (undefined4)uVar10;
        m_1.elemsize._4_4_ = (undefined4)(uVar10 >> 0x20);
        m_1.c = (this->bias_c_data).d;
        m_1.d = 1;
        iVar1 = (this->bias_c_data).dims;
        m_1.dims = iVar1 + -1;
        m_1.cstep = (uVar10 * (long)m_1.h * (long)m_1.w + 0xf & 0xfffffffffffffff0) / uVar10;
        if (iVar1 == 4) {
          m_1.cstep = (long)m_1.h * (long)m_1.w;
        }
        m_2.w = (this->weight_hc_data).w;
        m_2.h = (this->weight_hc_data).h;
        m_2.c = (this->weight_hc_data).d;
        m_2.data = (this->weight_hc_data).data;
        m_2.elemsize = (this->weight_hc_data).elemsize;
        m_2.elempack = (this->weight_hc_data).elempack;
        m_2.allocator = (this->weight_hc_data).allocator;
        m_2.refcount = (int *)0x0;
        m_2.d = 1;
        sVar8 = (long)m_2.h * (long)m_2.w;
        iVar1 = (this->weight_hc_data).dims;
        m_2.dims = iVar1 + -1;
        m_2.cstep = (m_2.elemsize * sVar8 + 0xf & 0xfffffffffffffff0) / m_2.elemsize;
        if (iVar1 == 4) {
          m_2.cstep = sVar8;
        }
        if (this->num_output == this->hidden_size) {
          m_3.cstep = 0;
          m_3.data = (void *)0x0;
          m_3.elemsize._0_4_ = 0;
          m_3.elemsize._4_4_ = 0;
          m_3.elempack = 0;
          m_3.allocator = (Allocator *)0x0;
          m_3.dims = 0;
          m_3.w = 0;
          m_3.h = 0;
          m_3.d = 0;
          m_3.c = 0;
        }
        else {
          m_3.w = (this->weight_hr_data).w;
          m_3.h = (this->weight_hr_data).h;
          m_3.c = (this->weight_hr_data).d;
          m_3.data = (this->weight_hr_data).data;
          uVar10 = (this->weight_hr_data).elemsize;
          m_3.elempack = (this->weight_hr_data).elempack;
          m_3.allocator = (this->weight_hr_data).allocator;
          m_3.elemsize._0_4_ = (undefined4)uVar10;
          m_3.elemsize._4_4_ = (undefined4)(uVar10 >> 0x20);
          m_3.d = 1;
          iVar1 = (this->weight_hr_data).dims;
          m_3.dims = iVar1 + -1;
          m_3.cstep = (uVar10 * (long)m_3.h * (long)m_3.w + 0xf & 0xfffffffffffffff0) / uVar10;
          if (iVar1 == 4) {
            m_3.cstep = (long)m_3.h * (long)m_3.w;
          }
        }
        m_3.refcount._4_4_ = 0;
        m_3.refcount._0_4_ = 0;
        iVar7 = lstm(bottom_blob,this_00,uVar6,&m,&m_1,&m_2,&m_3,&local_238,&local_288,opt);
      }
      else {
        m.w = (this->weight_xc_data).w;
        m.h = (this->weight_xc_data).h;
        m.data = (this->weight_xc_data).data;
        uVar10 = (this->weight_xc_data).elemsize;
        m.elempack = (this->weight_xc_data).elempack;
        m.allocator = (this->weight_xc_data).allocator;
        m.refcount._0_4_ = 0;
        m.refcount._4_4_ = 0;
        m.elemsize._0_4_ = (undefined4)uVar10;
        m.elemsize._4_4_ = (undefined4)(uVar10 >> 0x20);
        m.c = (this->weight_xc_data).d;
        m.d = 1;
        iVar1 = (this->weight_xc_data).dims;
        m.dims = iVar1 + -1;
        m.cstep = (uVar10 * (long)m.h * (long)m.w + 0xf & 0xfffffffffffffff0) / uVar10;
        if (iVar1 == 4) {
          m.cstep = (long)m.h * (long)m.w;
        }
        m_1.w = (this->bias_c_data).w;
        m_1.h = (this->bias_c_data).h;
        m_1.data = (this->bias_c_data).data;
        uVar10 = (this->bias_c_data).elemsize;
        m_1.elempack = (this->bias_c_data).elempack;
        m_1.allocator = (this->bias_c_data).allocator;
        m_1.refcount._0_4_ = 0;
        m_1.refcount._4_4_ = 0;
        m_1.elemsize._0_4_ = (undefined4)uVar10;
        m_1.elemsize._4_4_ = (undefined4)(uVar10 >> 0x20);
        m_1.c = (this->bias_c_data).d;
        m_1.d = 1;
        iVar1 = (this->bias_c_data).dims;
        m_1.dims = iVar1 + -1;
        m_1.cstep = (uVar10 * (long)m_1.h * (long)m_1.w + 0xf & 0xfffffffffffffff0) / uVar10;
        if (iVar1 == 4) {
          m_1.cstep = (long)m_1.h * (long)m_1.w;
        }
        m_2.w = (this->weight_hc_data).w;
        m_2.h = (this->weight_hc_data).h;
        m_2.c = (this->weight_hc_data).d;
        m_2.data = (this->weight_hc_data).data;
        m_2.elemsize = (this->weight_hc_data).elemsize;
        m_2.elempack = (this->weight_hc_data).elempack;
        m_2.allocator = (this->weight_hc_data).allocator;
        m_2.refcount = (int *)0x0;
        m_2.d = 1;
        sVar8 = (long)m_2.h * (long)m_2.w;
        iVar1 = (this->weight_hc_data).dims;
        m_2.dims = iVar1 + -1;
        m_2.cstep = (m_2.elemsize * sVar8 + 0xf & 0xfffffffffffffff0) / m_2.elemsize;
        if (iVar1 == 4) {
          m_2.cstep = sVar8;
        }
        if (this->num_output == this->hidden_size) {
          m_3.cstep = 0;
          m_3.data = (void *)0x0;
          m_3.elemsize._0_4_ = 0;
          m_3.elemsize._4_4_ = 0;
          m_3.elempack = 0;
          m_3.allocator = (Allocator *)0x0;
          m_3.dims = 0;
          m_3.w = 0;
          m_3.h = 0;
          m_3.d = 0;
          m_3.c = 0;
        }
        else {
          m_3.w = (this->weight_hr_data).w;
          m_3.h = (this->weight_hr_data).h;
          m_3.c = (this->weight_hr_data).d;
          m_3.data = (this->weight_hr_data).data;
          uVar10 = (this->weight_hr_data).elemsize;
          m_3.elempack = (this->weight_hr_data).elempack;
          m_3.allocator = (this->weight_hr_data).allocator;
          m_3.elemsize._0_4_ = (undefined4)uVar10;
          m_3.elemsize._4_4_ = (undefined4)(uVar10 >> 0x20);
          m_3.d = 1;
          iVar1 = (this->weight_hr_data).dims;
          m_3.dims = iVar1 + -1;
          m_3.cstep = (uVar10 * (long)m_3.h * (long)m_3.w + 0xf & 0xfffffffffffffff0) / uVar10;
          if (iVar1 == 4) {
            m_3.cstep = (long)m_3.h * (long)m_3.w;
          }
        }
        m_3.refcount._4_4_ = 0;
        m_3.refcount._0_4_ = 0;
        iVar7 = lstm_int8(bottom_blob,this_00,uVar6,&m,
                          (float *)(this->weight_xc_data_int8_scales).data,&m_1,&m_2,
                          (float *)(this->weight_hc_data_int8_scales).data,&m_3,&local_238,
                          &local_288,opt);
      }
      if (iVar7 != 0) goto LAB_00354932;
      uVar6 = this->direction;
    }
    if (uVar6 == 2) {
      m.cstep = 0;
      m.data = (void *)0x0;
      m.refcount._0_4_ = 0;
      m.refcount._4_4_ = 0;
      m.elemsize._0_4_ = 0;
      m.elemsize._4_4_ = 0;
      m.elempack = 0;
      m.allocator = (Allocator *)0x0;
      m.dims = 0;
      m.w = 0;
      m.h = 0;
      m.d = 0;
      m.c = 0;
      Mat::create(&m,this->num_output,_h,4,opt->workspace_allocator);
      iVar7 = -100;
      if ((m.data == (void *)0x0) || ((long)m.c * m.cstep == 0)) {
        bVar3 = false;
      }
      else {
        m_1.cstep = 0;
        m_1.data = (void *)0x0;
        m_1.refcount._0_4_ = 0;
        m_1.refcount._4_4_ = 0;
        m_1.elemsize._0_4_ = 0;
        m_1.elemsize._4_4_ = 0;
        m_1.elempack = 0;
        m_1.allocator = (Allocator *)0x0;
        m_1.dims = 0;
        m_1.w = 0;
        m_1.h = 0;
        m_1.d = 0;
        m_1.c = 0;
        Mat::create(&m_1,this->num_output,_h,4,opt->workspace_allocator);
        iVar7 = -100;
        if ((m_1.data == (void *)0x0) || ((long)m_1.c * m_1.cstep == 0)) {
          bVar3 = false;
        }
        else {
          m_2.cstep = (size_t)local_238.w;
          m_2.elemsize = CONCAT44(local_238.elemsize._4_4_,(undefined4)local_238.elemsize);
          m_2.data = local_238.data;
          m_2.refcount = (int *)0x0;
          m_2.elempack = local_238.elempack;
          m_2.allocator = local_238.allocator;
          m_2.dims = 2;
          m_2.w = local_238.w;
          m_2.h = 1;
          m_2.d = 1;
          m_2.c = 1;
          m_3.cstep = (size_t)local_288.w;
          m_3.data = local_288.data;
          m_3.refcount._0_4_ = 0;
          m_3.refcount._4_4_ = 0;
          m_3.elemsize._0_4_ = (undefined4)local_288.elemsize;
          m_3.elemsize._4_4_ = local_288.elemsize._4_4_;
          m_3.elempack = local_288.elempack;
          m_3.allocator = local_288.allocator;
          m_3.dims = 2;
          m_3.w = local_288.w;
          m_3.h = 1;
          m_3.d = 1;
          m_3.c = 1;
          if (this->int8_scale_term == 0) {
            m_8.w = (this->weight_xc_data).w;
            m_8.h = (this->weight_xc_data).h;
            m_8.c = (this->weight_xc_data).d;
            m_8.data = (this->weight_xc_data).data;
            m_8.elemsize = (this->weight_xc_data).elemsize;
            m_8.elempack = (this->weight_xc_data).elempack;
            m_8.allocator = (this->weight_xc_data).allocator;
            m_8.refcount = (int *)0x0;
            m_8.d = 1;
            sVar8 = (long)m_8.h * (long)m_8.w;
            iVar1 = (this->weight_xc_data).dims;
            m_8.dims = iVar1 + -1;
            m_8.cstep = (m_8.elemsize * sVar8 + 0xf & 0xfffffffffffffff0) / m_8.elemsize;
            if (iVar1 == 4) {
              m_8.cstep = sVar8;
            }
            m_9.w = (this->bias_c_data).w;
            m_9.h = (this->bias_c_data).h;
            m_9.c = (this->bias_c_data).d;
            m_9.data = (this->bias_c_data).data;
            m_9.elemsize = (this->bias_c_data).elemsize;
            m_9.elempack = (this->bias_c_data).elempack;
            m_9.allocator = (this->bias_c_data).allocator;
            m_9.refcount = (int *)0x0;
            m_9.d = 1;
            sVar8 = (long)m_9.h * (long)m_9.w;
            iVar1 = (this->bias_c_data).dims;
            m_9.dims = iVar1 + -1;
            m_9.cstep = (m_9.elemsize * sVar8 + 0xf & 0xfffffffffffffff0) / m_9.elemsize;
            if (iVar1 == 4) {
              m_9.cstep = sVar8;
            }
            m_10.w = (this->weight_hc_data).w;
            m_10.h = (this->weight_hc_data).h;
            m_10.c = (this->weight_hc_data).d;
            m_10.data = (this->weight_hc_data).data;
            m_10.elemsize = (this->weight_hc_data).elemsize;
            m_10.elempack = (this->weight_hc_data).elempack;
            m_10.allocator = (this->weight_hc_data).allocator;
            m_10.refcount = (int *)0x0;
            m_10.d = 1;
            iVar1 = (this->weight_hc_data).dims;
            m_10.dims = iVar1 + -1;
            m_10.cstep = (m_10.elemsize * (long)m_10.h * (long)m_10.w + 0xf & 0xfffffffffffffff0) /
                         m_10.elemsize;
            if (iVar1 == 4) {
              m_10.cstep = (long)m_10.h * (long)m_10.w;
            }
            if (this->num_output == this->hidden_size) {
              m_11.cstep = 0;
              m_11.data = (void *)0x0;
              m_11.elemsize._0_4_ = 0;
              m_11.elemsize._4_4_ = 0;
              m_11.elempack = 0;
              m_11.allocator = (Allocator *)0x0;
              m_11.dims = 0;
              m_11.w = 0;
              m_11.h = 0;
              m_11.d = 0;
              m_11.c = 0;
            }
            else {
              m_11.w = (this->weight_hr_data).w;
              m_11.h = (this->weight_hr_data).h;
              m_11.data = (this->weight_hr_data).data;
              uVar10 = (this->weight_hr_data).elemsize;
              m_11.elempack = (this->weight_hr_data).elempack;
              m_11.allocator = (this->weight_hr_data).allocator;
              m_11.elemsize._0_4_ = (undefined4)uVar10;
              m_11.elemsize._4_4_ = (undefined4)(uVar10 >> 0x20);
              m_11.c = (this->weight_hr_data).d;
              m_11.d = 1;
              iVar1 = (this->weight_hr_data).dims;
              m_11.dims = iVar1 + -1;
              m_11.cstep = (uVar10 * (long)m_11.h * (long)m_11.w + 0xf & 0xfffffffffffffff0) /
                           uVar10;
              if (iVar1 == 4) {
                m_11.cstep = (long)m_11.h * (long)m_11.w;
              }
            }
            m_11.refcount._4_4_ = 0;
            m_11.refcount._0_4_ = 0;
            iVar7 = lstm(bottom_blob,&m,0,&m_8,&m_9,&m_10,&m_11,&m_2,&m_3,opt);
          }
          else {
            m_8.w = (this->weight_xc_data).w;
            m_8.h = (this->weight_xc_data).h;
            m_8.c = (this->weight_xc_data).d;
            m_8.data = (this->weight_xc_data).data;
            m_8.elemsize = (this->weight_xc_data).elemsize;
            m_8.elempack = (this->weight_xc_data).elempack;
            m_8.allocator = (this->weight_xc_data).allocator;
            m_8.refcount = (int *)0x0;
            m_8.d = 1;
            sVar8 = (long)m_8.h * (long)m_8.w;
            iVar1 = (this->weight_xc_data).dims;
            m_8.dims = iVar1 + -1;
            m_8.cstep = (m_8.elemsize * sVar8 + 0xf & 0xfffffffffffffff0) / m_8.elemsize;
            if (iVar1 == 4) {
              m_8.cstep = sVar8;
            }
            m_9.w = (this->bias_c_data).w;
            m_9.h = (this->bias_c_data).h;
            m_9.c = (this->bias_c_data).d;
            m_9.data = (this->bias_c_data).data;
            m_9.elemsize = (this->bias_c_data).elemsize;
            m_9.elempack = (this->bias_c_data).elempack;
            m_9.allocator = (this->bias_c_data).allocator;
            m_9.refcount = (int *)0x0;
            m_9.d = 1;
            sVar8 = (long)m_9.h * (long)m_9.w;
            iVar1 = (this->bias_c_data).dims;
            m_9.dims = iVar1 + -1;
            m_9.cstep = (m_9.elemsize * sVar8 + 0xf & 0xfffffffffffffff0) / m_9.elemsize;
            if (iVar1 == 4) {
              m_9.cstep = sVar8;
            }
            m_10.w = (this->weight_hc_data).w;
            m_10.h = (this->weight_hc_data).h;
            m_10.c = (this->weight_hc_data).d;
            m_10.data = (this->weight_hc_data).data;
            m_10.elemsize = (this->weight_hc_data).elemsize;
            m_10.elempack = (this->weight_hc_data).elempack;
            m_10.allocator = (this->weight_hc_data).allocator;
            m_10.refcount = (int *)0x0;
            m_10.d = 1;
            iVar1 = (this->weight_hc_data).dims;
            m_10.dims = iVar1 + -1;
            m_10.cstep = (m_10.elemsize * (long)m_10.h * (long)m_10.w + 0xf & 0xfffffffffffffff0) /
                         m_10.elemsize;
            if (iVar1 == 4) {
              m_10.cstep = (long)m_10.h * (long)m_10.w;
            }
            if (this->num_output == this->hidden_size) {
              m_11.cstep = 0;
              m_11.data = (void *)0x0;
              m_11.elemsize._0_4_ = 0;
              m_11.elemsize._4_4_ = 0;
              m_11.elempack = 0;
              m_11.allocator = (Allocator *)0x0;
              m_11.dims = 0;
              m_11.w = 0;
              m_11.h = 0;
              m_11.d = 0;
              m_11.c = 0;
            }
            else {
              m_11.w = (this->weight_hr_data).w;
              m_11.h = (this->weight_hr_data).h;
              m_11.data = (this->weight_hr_data).data;
              uVar10 = (this->weight_hr_data).elemsize;
              m_11.elempack = (this->weight_hr_data).elempack;
              m_11.allocator = (this->weight_hr_data).allocator;
              m_11.elemsize._0_4_ = (undefined4)uVar10;
              m_11.elemsize._4_4_ = (undefined4)(uVar10 >> 0x20);
              m_11.c = (this->weight_hr_data).d;
              m_11.d = 1;
              iVar1 = (this->weight_hr_data).dims;
              m_11.dims = iVar1 + -1;
              m_11.cstep = (uVar10 * (long)m_11.h * (long)m_11.w + 0xf & 0xfffffffffffffff0) /
                           uVar10;
              if (iVar1 == 4) {
                m_11.cstep = (long)m_11.h * (long)m_11.w;
              }
            }
            m_11.refcount._4_4_ = 0;
            m_11.refcount._0_4_ = 0;
            iVar7 = lstm_int8(bottom_blob,&m,0,&m_8,(float *)(this->weight_xc_data_int8_scales).data
                              ,&m_9,&m_10,(float *)(this->weight_hc_data_int8_scales).data,&m_11,
                              &m_2,&m_3,opt);
          }
          if (iVar7 == 0) {
            m_8.cstep = (size_t)local_238.w;
            m_8.elemsize = CONCAT44(local_238.elemsize._4_4_,(undefined4)local_238.elemsize);
            m_8.data = (void *)(m_8.elemsize * m_8.cstep + (long)local_238.data);
            m_8.refcount = (int *)0x0;
            m_8.elempack = local_238.elempack;
            m_8.allocator = local_238.allocator;
            m_8.dims = 2;
            m_8.w = local_238.w;
            m_8.h = 1;
            m_8.d = 1;
            m_8.c = 1;
            m_9.cstep = (size_t)local_288.w;
            m_9.elemsize = CONCAT44(local_288.elemsize._4_4_,(undefined4)local_288.elemsize);
            m_9.data = (void *)(m_9.elemsize * m_9.cstep + (long)local_288.data);
            m_9.refcount = (int *)0x0;
            m_9.elempack = local_288.elempack;
            m_9.allocator = local_288.allocator;
            m_9.dims = 2;
            m_9.w = local_288.w;
            m_9.h = 1;
            m_9.d = 1;
            m_9.c = 1;
            if (this->int8_scale_term == 0) {
              m_10.w = (this->weight_xc_data).w;
              m_10.h = (this->weight_xc_data).h;
              m_10.c = (this->weight_xc_data).d;
              m_10.elemsize = (this->weight_xc_data).elemsize;
              m_10.data = (void *)((this->weight_xc_data).cstep * m_10.elemsize +
                                  (long)(this->weight_xc_data).data);
              m_10.elempack = (this->weight_xc_data).elempack;
              m_10.allocator = (this->weight_xc_data).allocator;
              m_10.refcount = (int *)0x0;
              m_10.d = 1;
              iVar1 = (this->weight_xc_data).dims;
              m_10.dims = iVar1 + -1;
              m_10.cstep = (m_10.elemsize * (long)m_10.h * (long)m_10.w + 0xf & 0xfffffffffffffff0)
                           / m_10.elemsize;
              if (iVar1 == 4) {
                m_10.cstep = (long)m_10.h * (long)m_10.w;
              }
              m_11.w = (this->bias_c_data).w;
              m_11.h = (this->bias_c_data).h;
              uVar10 = (this->bias_c_data).elemsize;
              m_11.data = (void *)((this->bias_c_data).cstep * uVar10 +
                                  (long)(this->bias_c_data).data);
              m_11.elempack = (this->bias_c_data).elempack;
              m_11.allocator = (this->bias_c_data).allocator;
              m_11.refcount._0_4_ = 0;
              m_11.refcount._4_4_ = 0;
              m_11.elemsize._0_4_ = (undefined4)uVar10;
              m_11.elemsize._4_4_ = (undefined4)(uVar10 >> 0x20);
              m_11.c = (this->bias_c_data).d;
              m_11.d = 1;
              iVar1 = (this->bias_c_data).dims;
              m_11.dims = iVar1 + -1;
              m_11.cstep = (uVar10 * (long)m_11.h * (long)m_11.w + 0xf & 0xfffffffffffffff0) /
                           uVar10;
              if (iVar1 == 4) {
                m_11.cstep = (long)m_11.h * (long)m_11.w;
              }
              m_18.w = (this->weight_hc_data).w;
              m_18.h = (this->weight_hc_data).h;
              m_18.c = (this->weight_hc_data).d;
              m_18.elemsize = (this->weight_hc_data).elemsize;
              m_18.data = (void *)((this->weight_hc_data).cstep * m_18.elemsize +
                                  (long)(this->weight_hc_data).data);
              m_18.elempack = (this->weight_hc_data).elempack;
              m_18.allocator = (this->weight_hc_data).allocator;
              m_18.refcount = (int *)0x0;
              m_18.d = 1;
              iVar1 = (this->weight_hc_data).dims;
              m_18.dims = iVar1 + -1;
              m_18.cstep = (m_18.elemsize * (long)m_18.h * (long)m_18.w + 0xf & 0xfffffffffffffff0)
                           / m_18.elemsize;
              if (iVar1 == 4) {
                m_18.cstep = (long)m_18.h * (long)m_18.w;
              }
              if (this->num_output == this->hidden_size) {
                m_19.cstep = 0;
                m_19.data = (void *)0x0;
                m_19.elemsize._0_4_ = 0;
                m_19.elemsize._4_4_ = 0;
                m_19.elempack = 0;
                m_19.allocator = (Allocator *)0x0;
                m_19.dims = 0;
                m_19.w = 0;
                m_19.h = 0;
                m_19.d = 0;
                m_19.c = 0;
              }
              else {
                m_19.w = (this->weight_hr_data).w;
                m_19.h = (this->weight_hr_data).h;
                uVar10 = (this->weight_hr_data).elemsize;
                m_19.data = (void *)((this->weight_hr_data).cstep * uVar10 +
                                    (long)(this->weight_hr_data).data);
                m_19.elempack = (this->weight_hr_data).elempack;
                m_19.allocator = (this->weight_hr_data).allocator;
                m_19.elemsize._0_4_ = (undefined4)uVar10;
                m_19.elemsize._4_4_ = (undefined4)(uVar10 >> 0x20);
                m_19.c = (this->weight_hr_data).d;
                m_19.d = 1;
                iVar1 = (this->weight_hr_data).dims;
                m_19.dims = iVar1 + -1;
                m_19.cstep = (uVar10 * (long)m_19.h * (long)m_19.w + 0xf & 0xfffffffffffffff0) /
                             uVar10;
                if (iVar1 == 4) {
                  m_19.cstep = (long)m_19.h * (long)m_19.w;
                }
              }
              m_19.refcount._4_4_ = 0;
              m_19.refcount._0_4_ = 0;
              iVar7 = lstm(bottom_blob,&m_1,1,&m_10,&m_11,&m_18,&m_19,&m_8,&m_9,opt);
            }
            else {
              m_10.w = (this->weight_xc_data).w;
              m_10.h = (this->weight_xc_data).h;
              m_10.c = (this->weight_xc_data).d;
              m_10.elemsize = (this->weight_xc_data).elemsize;
              m_10.data = (void *)((this->weight_xc_data).cstep * m_10.elemsize +
                                  (long)(this->weight_xc_data).data);
              m_10.elempack = (this->weight_xc_data).elempack;
              m_10.allocator = (this->weight_xc_data).allocator;
              m_10.refcount = (int *)0x0;
              m_10.d = 1;
              iVar1 = (this->weight_xc_data).dims;
              m_10.dims = iVar1 + -1;
              m_10.cstep = (m_10.elemsize * (long)m_10.h * (long)m_10.w + 0xf & 0xfffffffffffffff0)
                           / m_10.elemsize;
              if (iVar1 == 4) {
                m_10.cstep = (long)m_10.h * (long)m_10.w;
              }
              m_11.w = (this->bias_c_data).w;
              m_11.h = (this->bias_c_data).h;
              uVar10 = (this->bias_c_data).elemsize;
              m_11.data = (void *)((this->bias_c_data).cstep * uVar10 +
                                  (long)(this->bias_c_data).data);
              m_11.elempack = (this->bias_c_data).elempack;
              m_11.allocator = (this->bias_c_data).allocator;
              m_11.refcount._0_4_ = 0;
              m_11.refcount._4_4_ = 0;
              m_11.elemsize._0_4_ = (undefined4)uVar10;
              m_11.elemsize._4_4_ = (undefined4)(uVar10 >> 0x20);
              m_11.c = (this->bias_c_data).d;
              m_11.d = 1;
              iVar1 = (this->bias_c_data).dims;
              m_11.dims = iVar1 + -1;
              m_11.cstep = (uVar10 * (long)m_11.h * (long)m_11.w + 0xf & 0xfffffffffffffff0) /
                           uVar10;
              if (iVar1 == 4) {
                m_11.cstep = (long)m_11.h * (long)m_11.w;
              }
              m_18.w = (this->weight_hc_data).w;
              m_18.h = (this->weight_hc_data).h;
              m_18.c = (this->weight_hc_data).d;
              m_18.elemsize = (this->weight_hc_data).elemsize;
              m_18.data = (void *)((this->weight_hc_data).cstep * m_18.elemsize +
                                  (long)(this->weight_hc_data).data);
              m_18.elempack = (this->weight_hc_data).elempack;
              m_18.allocator = (this->weight_hc_data).allocator;
              m_18.refcount = (int *)0x0;
              m_18.d = 1;
              iVar1 = (this->weight_hc_data).dims;
              m_18.dims = iVar1 + -1;
              m_18.cstep = (m_18.elemsize * (long)m_18.h * (long)m_18.w + 0xf & 0xfffffffffffffff0)
                           / m_18.elemsize;
              if (iVar1 == 4) {
                m_18.cstep = (long)m_18.h * (long)m_18.w;
              }
              if (this->num_output == this->hidden_size) {
                m_19.cstep = 0;
                m_19.data = (void *)0x0;
                m_19.elemsize._0_4_ = 0;
                m_19.elemsize._4_4_ = 0;
                m_19.elempack = 0;
                m_19.allocator = (Allocator *)0x0;
                m_19.dims = 0;
                m_19.w = 0;
                m_19.h = 0;
                m_19.d = 0;
                m_19.c = 0;
              }
              else {
                m_19.w = (this->weight_hr_data).w;
                m_19.h = (this->weight_hr_data).h;
                uVar10 = (this->weight_hr_data).elemsize;
                m_19.data = (void *)((this->weight_hr_data).cstep * uVar10 +
                                    (long)(this->weight_hr_data).data);
                m_19.elempack = (this->weight_hr_data).elempack;
                m_19.allocator = (this->weight_hr_data).allocator;
                m_19.elemsize._0_4_ = (undefined4)uVar10;
                m_19.elemsize._4_4_ = (undefined4)(uVar10 >> 0x20);
                m_19.c = (this->weight_hr_data).d;
                m_19.d = 1;
                iVar1 = (this->weight_hr_data).dims;
                m_19.dims = iVar1 + -1;
                m_19.cstep = (uVar10 * (long)m_19.h * (long)m_19.w + 0xf & 0xfffffffffffffff0) /
                             uVar10;
                if (iVar1 == 4) {
                  m_19.cstep = (long)m_19.h * (long)m_19.w;
                }
              }
              m_19.refcount._4_4_ = 0;
              m_19.refcount._0_4_ = 0;
              iVar7 = lstm_int8(bottom_blob,&m_1,1,&m_10,
                                (float *)((long)(this->weight_xc_data_int8_scales).w *
                                          (this->weight_xc_data_int8_scales).elemsize +
                                         (long)(this->weight_xc_data_int8_scales).data),&m_11,&m_18,
                                (float *)((long)(this->weight_hc_data_int8_scales).w *
                                          (this->weight_hc_data_int8_scales).elemsize +
                                         (long)(this->weight_hc_data_int8_scales).data),&m_19,&m_8,
                                &m_9,opt);
            }
            if (iVar7 == 0) {
              bVar3 = true;
              iVar7 = 0;
              if (0 < (int)_h) {
                uVar10 = 0;
                do {
                  __src = (void *)((long)m_1.w * uVar10 *
                                   CONCAT44(m_1.elemsize._4_4_,(undefined4)m_1.elemsize) +
                                  (long)m_1.data);
                  __dest = (void *)((long)this_00->w * uVar10 * this_00->elemsize +
                                   (long)this_00->data);
                  memcpy(__dest,(void *)((long)m.w * uVar10 *
                                         CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize) +
                                        (long)m.data),(long)this->num_output << 2);
                  memcpy((void *)((long)this->num_output * 4 + (long)__dest),__src,
                         (long)this->num_output << 2);
                  uVar10 = uVar10 + 1;
                } while (_h != uVar10);
                bVar3 = true;
              }
            }
            else {
              bVar3 = false;
            }
            if (m_8.refcount != (int *)0x0) {
              LOCK();
              *m_8.refcount = *m_8.refcount + -1;
              UNLOCK();
              if (*m_8.refcount == 0) {
                if (m_8.allocator == (Allocator *)0x0) {
                  if (m_8.data != (void *)0x0) {
                    free(m_8.data);
                  }
                }
                else {
                  (*(m_8.allocator)->_vptr_Allocator[3])();
                }
              }
            }
          }
          else {
            bVar3 = false;
          }
          piVar2 = (int *)CONCAT44(m_3.refcount._4_4_,m_3.refcount._0_4_);
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              if (m_3.allocator == (Allocator *)0x0) {
                if (m_3.data != (void *)0x0) {
                  free(m_3.data);
                }
              }
              else {
                (*(m_3.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          if (m_2.refcount != (int *)0x0) {
            LOCK();
            *m_2.refcount = *m_2.refcount + -1;
            UNLOCK();
            if (*m_2.refcount == 0) {
              if (m_2.allocator == (Allocator *)0x0) {
                if (m_2.data != (void *)0x0) {
                  free(m_2.data);
                }
              }
              else {
                (*(m_2.allocator)->_vptr_Allocator[3])();
              }
            }
          }
        }
        piVar2 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            if (m_1.allocator == (Allocator *)0x0) {
              if (m_1.data != (void *)0x0) {
                free(m_1.data);
              }
            }
            else {
              (*(m_1.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
      piVar2 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (m.allocator == (Allocator *)0x0) {
            if (m.data != (void *)0x0) {
              free(m.data);
            }
          }
          else {
            (*(m.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      if (!bVar3) goto LAB_00354932;
    }
    pMVar9 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    iVar7 = 0;
    if ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_finish - (long)pMVar9 == 0xd8) {
      if (pMVar9 + 1 != &local_238) {
        piVar2 = (int *)CONCAT44(local_238.refcount._4_4_,local_238.refcount._0_4_);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + 1;
          UNLOCK();
        }
        piVar2 = pMVar9[1].refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            if (pMVar9[1].allocator == (Allocator *)0x0) {
              if (pMVar9[1].data != (void *)0x0) {
                free(pMVar9[1].data);
              }
            }
            else {
              (*(pMVar9[1].allocator)->_vptr_Allocator[3])();
            }
          }
        }
        pMVar9[1].data = local_238.data;
        pMVar9[1].refcount = (int *)CONCAT44(local_238.refcount._4_4_,local_238.refcount._0_4_);
        pMVar9[1].elemsize = CONCAT44(local_238.elemsize._4_4_,(undefined4)local_238.elemsize);
        pMVar9[1].elempack = local_238.elempack;
        pMVar9[1].allocator = local_238.allocator;
        pMVar9[1].dims = local_238.dims;
        pMVar9[1].w = local_238.w;
        pMVar9[1].h = local_238.h;
        pMVar9[1].d = local_238.d;
        pMVar9[1].c = local_238.c;
        pMVar9[1].cstep = local_238.cstep;
        pMVar9 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      }
      if (pMVar9 + 2 != &local_288) {
        piVar2 = (int *)CONCAT44(local_288.refcount._4_4_,local_288.refcount._0_4_);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + 1;
          UNLOCK();
        }
        piVar2 = pMVar9[2].refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            if (pMVar9[2].allocator == (Allocator *)0x0) {
              if (pMVar9[2].data != (void *)0x0) {
                free(pMVar9[2].data);
              }
            }
            else {
              (*(pMVar9[2].allocator)->_vptr_Allocator[3])();
            }
          }
        }
        pMVar9[2].data = local_288.data;
        pMVar9[2].refcount = (int *)CONCAT44(local_288.refcount._4_4_,local_288.refcount._0_4_);
        pMVar9[2].elemsize = CONCAT44(local_288.elemsize._4_4_,(undefined4)local_288.elemsize);
        pMVar9[2].elempack = local_288.elempack;
        pMVar9[2].allocator = local_288.allocator;
        pMVar9[2].dims = local_288.dims;
        pMVar9[2].w = local_288.w;
        pMVar9[2].h = local_288.h;
        pMVar9[2].d = local_288.d;
        pMVar9[2].c = local_288.c;
        pMVar9[2].cstep = local_288.cstep;
        iVar7 = 0;
      }
    }
  }
LAB_00354932:
  piVar2 = (int *)CONCAT44(local_288.refcount._4_4_,local_288.refcount._0_4_);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      if (local_288.allocator == (Allocator *)0x0) {
        if (local_288.data != (void *)0x0) {
          free(local_288.data);
        }
      }
      else {
        (*(local_288.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  piVar2 = (int *)CONCAT44(local_238.refcount._4_4_,local_238.refcount._0_4_);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      if (local_238.allocator == (Allocator *)0x0) {
        if (local_238.data != (void *)0x0) {
          free(local_238.data);
        }
      }
      else {
        (*(local_238.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar7;
}

Assistant:

int LSTM::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int T = bottom_blob.h;
    int num_directions = direction == 2 ? 2 : 1;

    Mat hidden;
    Mat cell;
    Allocator* hidden_cell_allocator = top_blobs.size() == 3 ? opt.blob_allocator : opt.workspace_allocator;
    if (bottom_blobs.size() == 3)
    {
        hidden = bottom_blobs[1].clone(hidden_cell_allocator);
        cell = bottom_blobs[2].clone(hidden_cell_allocator);
    }
    else
    {
        hidden.create(num_output, num_directions, 4u, hidden_cell_allocator);
        if (hidden.empty())
            return -100;
        hidden.fill(0.f);

        cell.create(hidden_size, num_directions, 4u, hidden_cell_allocator);
        if (cell.empty())
            return -100;
        cell.fill(0.f);
    }

    Mat& top_blob = top_blobs[0];
    top_blob.create(num_output * num_directions, T, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // Uni directional
    if (direction == 0 || direction == 1)
    {
#if NCNN_INT8
        if (int8_scale_term)
        {
            int ret = lstm_int8(bottom_blob, top_blob, direction, weight_xc_data.channel(0), weight_xc_data_int8_scales.row(0), bias_c_data.channel(0), weight_hc_data.channel(0), weight_hc_data_int8_scales.row(0), num_output == hidden_size ? Mat() : weight_hr_data.channel(0), hidden, cell, opt);
            if (ret != 0)
                return ret;
        }
        else
#endif
        {
            int ret = lstm(bottom_blob, top_blob, direction, weight_xc_data.channel(0), bias_c_data.channel(0), weight_hc_data.channel(0), num_output == hidden_size ? Mat() : weight_hr_data.channel(0), hidden, cell, opt);
            if (ret != 0)
                return ret;
        }
    }

    if (direction == 2)
    {
        Mat top_blob_forward(num_output, T, 4u, opt.workspace_allocator);
        if (top_blob_forward.empty())
            return -100;

        Mat top_blob_reverse(num_output, T, 4u, opt.workspace_allocator);
        if (top_blob_reverse.empty())
            return -100;

        Mat hidden0 = hidden.row_range(0, 1);
        Mat cell0 = cell.row_range(0, 1);
#if NCNN_INT8
        if (int8_scale_term)
        {
            int ret = lstm_int8(bottom_blob, top_blob_forward, 0, weight_xc_data.channel(0), weight_xc_data_int8_scales.row(0), bias_c_data.channel(0), weight_hc_data.channel(0), weight_hc_data_int8_scales.row(0), num_output == hidden_size ? Mat() : weight_hr_data.channel(0), hidden0, cell0, opt);
            if (ret != 0)
                return ret;
        }
        else
#endif
        {
            int ret = lstm(bottom_blob, top_blob_forward, 0, weight_xc_data.channel(0), bias_c_data.channel(0), weight_hc_data.channel(0), num_output == hidden_size ? Mat() : weight_hr_data.channel(0), hidden0, cell0, opt);
            if (ret != 0)
                return ret;
        }

        Mat hidden1 = hidden.row_range(1, 1);
        Mat cell1 = cell.row_range(1, 1);
#if NCNN_INT8
        if (int8_scale_term)
        {
            int ret = lstm_int8(bottom_blob, top_blob_reverse, 1, weight_xc_data.channel(1), weight_xc_data_int8_scales.row(1), bias_c_data.channel(1), weight_hc_data.channel(1), weight_hc_data_int8_scales.row(1), num_output == hidden_size ? Mat() : weight_hr_data.channel(1), hidden1, cell1, opt);
            if (ret != 0)
                return ret;
        }
        else
#endif
        {
            int ret = lstm(bottom_blob, top_blob_reverse, 1, weight_xc_data.channel(1), bias_c_data.channel(1), weight_hc_data.channel(1), num_output == hidden_size ? Mat() : weight_hr_data.channel(1), hidden1, cell1, opt);
            if (ret != 0)
                return ret;
        }

        // concat w
        for (int i = 0; i < T; i++)
        {
            const float* pf = top_blob_forward.row(i);
            const float* pr = top_blob_reverse.row(i);
            float* ptr = top_blob.row(i);

            memcpy(ptr, pf, num_output * sizeof(float));
            memcpy(ptr + num_output, pr, num_output * sizeof(float));
        }
    }

    if (top_blobs.size() == 3)
    {
        top_blobs[1] = hidden;
        top_blobs[2] = cell;
    }

    return 0;
}